

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O3

int ExorLinkCubeIteratorStart(Cube **pGroup,Cube *pC1,Cube *pC2,cubedist Dist)

{
  drow *pdVar1;
  drow *pdVar2;
  int iVar3;
  Cube *pCVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Cube *pCVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  drow *pdVar14;
  int (*paiVar15) [4];
  long lVar16;
  int *piVar17;
  long lVar18;
  int (*paiVar19) [3];
  int iVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  
  if (pC1 == (Cube *)0x0) {
    __assert_fail("pC1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x180,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  if (pC2 == (Cube *)0x0) {
    __assert_fail("pC2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x181,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  if (fWorking == '\x01') {
    __assert_fail("!fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x182,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  nCubes = Dist + DIST4;
  nCubesInGroup = s_ELnCubes[(int)Dist];
  nGroups = s_ELnGroups[Dist];
  nDist = Dist;
  pCA = pC1;
  pCB = pC2;
  uVar6 = FindDiffVars(DiffVars,pC1,pC2);
  iVar3 = nCubes;
  iVar7 = 0;
  if (nCubes != uVar6) goto LAB_008905a0;
  if (0 < (long)g_CoverInfo.nWordsIn) {
    memcpy(DammyBitData,pCA->pCubeDataIn,(long)g_CoverInfo.nWordsIn << 2);
  }
  piVar17 = DiffVars + 1;
  if (-1 < DiffVars[0]) {
    piVar17 = DiffVars;
  }
  uVar8 = (DiffVars[0] >> 0x1f) + uVar6;
  nDiffVarsIn = uVar8;
  pDiffVars = piVar17;
  if (uVar8 == 0 || SCARRY4(DiffVars[0] >> 0x1f,uVar6) != (int)uVar8 < 0) {
    StartingLiterals = (int)pCA->a;
LAB_00890186:
    uVar11 = 0;
  }
  else {
    lVar18 = 0;
    uVar21 = (ulong)uVar8;
    do {
      iVar7 = *(int *)((long)piVar17 + lVar18) >> 4;
      uVar11 = *(int *)((long)piVar17 + lVar18) * 2 & 0x1e;
      DammyBitData[iVar7] = DammyBitData[iVar7] & ~(3 << (sbyte)uVar11);
      *(int *)((long)DiffVarWords + lVar18) = iVar7;
      *(uint *)((long)DiffVarBits + lVar18) = uVar11;
      lVar18 = lVar18 + 4;
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
    StartingLiterals = (int)pCA->a;
    if ((int)uVar8 < 1) goto LAB_00890186;
    pdVar1 = pCA->pCubeDataIn;
    pdVar14 = pCB->pCubeDataIn;
    lVar18 = 0;
    lVar23 = 0;
    uVar11 = 0;
    iVar7 = StartingLiterals;
    do {
      iVar20 = *(int *)((long)DiffVarWords + lVar18);
      bVar10 = (byte)*(undefined4 *)((long)DiffVarBits + lVar18);
      uVar12 = pdVar1[iVar20] >> (bVar10 & 0x1f) & 3;
      *(uint *)((long)DiffVarValues[0] + lVar23) = uVar12;
      if (uVar12 != 3) {
        uVar11 = uVar11 | 1 << ((uint)lVar18 & 0x1f);
        StartingLiterals = iVar7 + -1;
        iVar7 = StartingLiterals;
      }
      uVar22 = pdVar14[iVar20] >> (bVar10 & 0x1f) & 3;
      *(uint *)((long)DiffVarValues[0] + lVar23 + 4) = uVar22;
      uVar13 = 0;
      if (uVar22 != 3) {
        uVar13 = 2 << ((byte)lVar18 & 0x1f);
      }
      *(uint *)((long)DiffVarValues[0] + lVar23 + 8) = uVar12 ^ uVar22;
      uVar24 = 0;
      if ((uVar12 ^ uVar22) != 3) {
        uVar24 = 4 << ((byte)lVar18 & 0x1f);
      }
      uVar11 = uVar11 | uVar13 | uVar24;
      lVar23 = lVar23 + 0xc;
      lVar18 = lVar18 + 4;
    } while ((ulong)uVar8 * 0xc != lVar23);
  }
  lVar18 = (long)nCubesInGroup;
  if (0 < lVar18) {
    lVar23 = 0;
    do {
      *(uint *)((long)CubeLiterals + lVar23) =
           (uint)BitCount[*(uint *)((long)s_CubeLitMasks[Dist] + lVar23) & uVar11];
      lVar23 = lVar23 + 4;
    } while (lVar18 * 4 != lVar23);
  }
  iVar7 = nGroups;
  lVar18 = (long)nGroups;
  if (0 < lVar18) {
    paiVar15 = s_ELGroupRules[Dist];
    lVar23 = 0;
    piVar17 = GroupCosts;
    do {
      GroupCosts[lVar23] = 0;
      if (0 < (int)uVar6) {
        uVar21 = 0;
        iVar20 = 0;
        do {
          iVar20 = iVar20 + CubeLiterals[(*(int (*) [4])*paiVar15)[uVar21]];
          uVar21 = uVar21 + 1;
        } while (uVar6 != uVar21);
        GroupCosts[lVar23] = iVar20;
      }
      lVar23 = lVar23 + 1;
      paiVar15 = paiVar15 + 1;
    } while (lVar23 != lVar18);
    if (0 < iVar7) {
      iVar7 = -1;
      lVar23 = 0;
      do {
        if (iVar7 < *piVar17) {
          GroupCostBestNum = (int)lVar23;
          iVar7 = *piVar17;
        }
        lVar23 = lVar23 + 1;
        piVar17 = piVar17 + 1;
      } while (lVar18 != lVar23);
    }
  }
  LastGroup = 0;
  if (0 < (int)uVar6) {
    lVar18 = 0;
    do {
      CubeNum = s_ELGroupRules[Dist][GroupCostBestNum][lVar18];
      LastGroup = LastGroup | s_BitMasks[CubeNum];
      pCVar9 = GetFreeCube();
      lVar23 = (long)CubeNum;
      ELCubes[lVar23] = pCVar9;
      if (0 < g_CoverInfo.nWordsIn) {
        pdVar1 = pCVar9->pCubeDataIn;
        pdVar14 = DammyBitData;
        lVar16 = 0;
        do {
          pdVar1[lVar16] = *pdVar14;
          lVar16 = lVar16 + 1;
          pdVar14 = pdVar14 + 1;
        } while (lVar16 < g_CoverInfo.nWordsIn);
      }
      uVar8 = nDiffVarsIn;
      pCVar4 = pCA;
      NewZ = 0;
      if (DiffVars[0] < 0) {
        iVar7 = s_ELCubeRules[Dist][lVar23][nDiffVarsIn];
        if (iVar7 == 0) {
          if (0 < g_CoverInfo.nWordsOut) {
            pdVar1 = pCA->pCubeDataOut;
            pdVar14 = pCVar9->pCubeDataOut;
            lVar16 = 0;
            NewZ = 0;
            do {
              uVar11 = pdVar1[lVar16];
              pdVar14[lVar16] = uVar11;
              NewZ = NewZ + (uint)BitCount[uVar11 >> 0x10] + (uint)BitCount[uVar11 & 0xffff];
              lVar16 = lVar16 + 1;
            } while (lVar16 < g_CoverInfo.nWordsOut);
          }
        }
        else if (iVar7 == 1) {
          if (0 < g_CoverInfo.nWordsOut) {
            pdVar1 = pCB->pCubeDataOut;
            pdVar14 = pCVar9->pCubeDataOut;
            lVar16 = 0;
            NewZ = 0;
            do {
              uVar11 = pdVar1[lVar16];
              pdVar14[lVar16] = uVar11;
              NewZ = NewZ + (uint)BitCount[uVar11 >> 0x10] + (uint)BitCount[uVar11 & 0xffff];
              lVar16 = lVar16 + 1;
            } while (lVar16 < g_CoverInfo.nWordsOut);
          }
        }
        else if ((iVar7 == 2) && (0 < g_CoverInfo.nWordsOut)) {
          pdVar1 = pCA->pCubeDataOut;
          pdVar14 = pCB->pCubeDataOut;
          pdVar2 = pCVar9->pCubeDataOut;
          lVar16 = 0;
          NewZ = 0;
          do {
            uVar11 = pdVar14[lVar16] ^ pdVar1[lVar16];
            pdVar2[lVar16] = uVar11;
            NewZ = NewZ + (uint)BitCount[uVar11 >> 0x10] + (uint)BitCount[uVar11 & 0xffff];
            lVar16 = lVar16 + 1;
          } while (lVar16 < g_CoverInfo.nWordsOut);
        }
      }
      else {
        if (0 < g_CoverInfo.nWordsOut) {
          pdVar1 = pCA->pCubeDataOut;
          pdVar14 = pCVar9->pCubeDataOut;
          lVar16 = 0;
          do {
            pdVar14[lVar16] = pdVar1[lVar16];
            lVar16 = lVar16 + 1;
          } while (lVar16 < g_CoverInfo.nWordsOut);
        }
        NewZ = (int)pCVar4->z;
        uVar8 = nDiffVarsIn;
      }
      iVar7 = NewZ;
      if (0 < (int)uVar8) {
        pdVar1 = pCVar9->pCubeDataIn;
        paiVar19 = DiffVarValues;
        lVar16 = 0;
        do {
          pdVar1[*(int *)((long)DiffVarWords + lVar16)] =
               pdVar1[*(int *)((long)DiffVarWords + lVar16)] |
               (*paiVar19)[*(int *)((long)s_ELCubeRules[Dist][lVar23] + lVar16)] <<
               (*(byte *)((long)DiffVarBits + lVar16) & 0x1f);
          lVar16 = lVar16 + 4;
          paiVar19 = paiVar19 + 1;
        } while ((ulong)uVar8 << 2 != lVar16);
      }
      pCVar9->a = (short)CubeLiterals[lVar23] + (short)StartingLiterals;
      pCVar9->z = (short)iVar7;
      iVar7 = ComputeQCostBits(pCVar9);
      pCVar9 = ELCubes[CubeNum];
      pCVar9->q = (short)iVar7;
      iVar7 = g_CoverInfo.cIDs + 1;
      bVar5 = (byte)g_CoverInfo.cIDs;
      g_CoverInfo.cIDs = iVar7;
      pCVar9->ID = bVar5;
      if (iVar7 == 0x100) {
        g_CoverInfo.cIDs = 1;
      }
      pGroup[lVar18] = pCVar9;
      lVar18 = lVar18 + 1;
    } while (lVar18 < nCubes);
  }
  VisitedGroups = VisitedGroups | s_BitMasks[GroupCostBestNum];
  GroupOrder[0] = GroupCostBestNum;
  nVisitedGroups = 1;
  iVar7 = 1;
LAB_008905a0:
  fWorking = iVar3 == uVar6;
  return iVar7;
}

Assistant:

int ExorLinkCubeIteratorStart( Cube** pGroup, Cube* pC1, Cube* pC2, cubedist Dist )
// this function starts the Exor-Link iterator, which iterates
// through the cube groups starting from the group with min literals
// returns 1 on success, returns 0 if the cubes have wrong distance
{
    int i, c;

    // check that everything is okey
    assert( pC1 != NULL );
    assert( pC2 != NULL );
    assert( !fWorking );

    nDist = Dist;
    nCubes = Dist + 2;
    nCubesInGroup = s_ELnCubes[nDist];
    nGroups = s_ELnGroups[Dist];
    pCA = pC1;
    pCB = pC2;
    // find what variables are different in these two cubes
    // FindDiffVars returns DiffVars[0] < 0, if the output is different
    nDifferentVars = FindDiffVars( DiffVars, pCA, pCB );
    if ( nCubes != nDifferentVars )
    {
//      cout << "ExorLinkCubeIterator(): Distance mismatch";
//      cout << " nCubes = " << nCubes << " nDiffVars = " << nDifferentVars << endl;
        fWorking = 0;
        return 0;
    }

    // copy the input variable cube data into DammyBitData[]
    for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
        DammyBitData[i] = pCA->pCubeDataIn[i];

    // find the number of different input variables
    nDiffVarsIn = ( DiffVars[0] >= 0 )? nCubes: nCubes-1;
    // assign the pointer to the place where the number of diff input vars is stored
    pDiffVars   = ( DiffVars[0] >= 0 )? DiffVars: DiffVars+1;
    // find the bit offsets and remove different variables
    for ( i = 0; i < nDiffVarsIn; i++ )
    {
        DiffVarWords[i] = ((2*pDiffVars[i]) >> LOGBPI) ;
        DiffVarBits[i]  = ((2*pDiffVars[i]) & BPIMASK);
        // clear this position
        DammyBitData[ DiffVarWords[i] ] &= ~( 3 << DiffVarBits[i] );
    }

    // extract the values from the cubes and create the mask of literals
    MaskLiterals = 0;
    // initialize the base for literal counts
    StartingLiterals = pCA->a;
    for ( i = 0, BitShift = 0; i < nDiffVarsIn; i++, BitShift++ )
    {
        DiffVarValues[i][0] = ( pCA->pCubeDataIn[DiffVarWords[i]] >> DiffVarBits[i] ) & 3;
        if ( DiffVarValues[i][0] != VAR_ABS )
        {
            MaskLiterals |= ( 1 << BitShift );
            // update the base for literal counts
            StartingLiterals--;
        }
        BitShift++;

        DiffVarValues[i][1] = ( pCB->pCubeDataIn[DiffVarWords[i]] >> DiffVarBits[i] ) & 3;
        if ( DiffVarValues[i][1] != VAR_ABS )
            MaskLiterals |= ( 1 << BitShift );
        BitShift++;

        DiffVarValues[i][2] = DiffVarValues[i][0] ^ DiffVarValues[i][1];
        if ( DiffVarValues[i][2] != VAR_ABS )
            MaskLiterals |= ( 1 << BitShift );
        BitShift++;
    }

    // count the number of additional literals in each cube of the group
    for ( i = 0; i < nCubesInGroup; i++ )
        CubeLiterals[i] = BitCount[ MaskLiterals & s_CubeLitMasks[Dist][i] ];

    // compute the costs of all groups
    for ( i = 0; i < nGroups; i++ )
        // go over all cubes in the group
        for ( GroupCosts[i] = 0, c = 0; c < nCubes; c++ )
            GroupCosts[i] += CubeLiterals[ s_ELGroupRules[Dist][i][c] ];

    // find the best cost group
    if ( fMinLitGroupsFirst[Dist] ) 
    { // find the minimum cost group
        GroupCostBest = LARGE_NUM;
        for ( i = 0; i < nGroups; i++ )
            if ( GroupCostBest > GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
    }
    else 
    { // find the maximum cost group
        GroupCostBest = -1;
        for ( i = 0; i < nGroups; i++ )
            if ( GroupCostBest < GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
    }

    // create the cubes with min number of literals needed for the group
    LastGroup = 0;
    for ( c = 0; c < nCubes; c++ )
    {
        CubeNum = s_ELGroupRules[Dist][GroupCostBestNum][c];
        LastGroup |= s_BitMasks[CubeNum];

        // bring a cube from the free cube list
        ELCubes[CubeNum] = GetFreeCube();

        // copy the input bit data into the cube 
        for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
            ELCubes[CubeNum]->pCubeDataIn[i] = DammyBitData[i];

        // copy the output bit data into the cube
        NewZ = 0;
        if ( DiffVars[0] >= 0 ) // the output is not involved in ExorLink
        {
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                ELCubes[CubeNum]->pCubeDataOut[i] = pCA->pCubeDataOut[i];
            NewZ = pCA->z;
        }
        else // the output is involved
        { // determine where the output information comes from
            Value = s_ELCubeRules[Dist][CubeNum][nDiffVarsIn];
            if ( Value == vs0 )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCA->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
            else if ( Value == vs1 )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCB->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
            else if ( Value == vsX )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCA->pCubeDataOut[i] ^ pCB->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
        }

        // set the variables that should be there
        for ( i = 0; i < nDiffVarsIn; i++ )
        {
            Value = DiffVarValues[i][ s_ELCubeRules[Dist][CubeNum][i] ];
            ELCubes[CubeNum]->pCubeDataIn[ DiffVarWords[i] ] |= ( Value << DiffVarBits[i] );
        }

        // set the number of literals
        ELCubes[CubeNum]->a = StartingLiterals + CubeLiterals[CubeNum];
        ELCubes[CubeNum]->z = NewZ;
        ELCubes[CubeNum]->q = ComputeQCostBits( ELCubes[CubeNum] );

        // assign the ID
        ELCubes[CubeNum]->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // prepare the return array
        pGroup[c] = ELCubes[CubeNum];
    }

    // mark this group as visited 
    VisitedGroups |= s_BitMasks[ GroupCostBestNum ];
    // set the first visited group number
    GroupOrder[0] = GroupCostBestNum;
    // increment the counter of visited groups
    nVisitedGroups = 1;
    fWorking = 1;
    return 1;
}